

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall QCss::Parser::parseCombinator(Parser *this,Relation *relation)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Relation RVar4;
  Symbol *pSVar5;
  long lVar6;
  long lVar7;
  
  *relation = NoRelation;
  iVar3 = this->index;
  lVar6 = (long)iVar3;
  lVar2 = lVar6 + -1;
  lVar1 = (this->symbols).d.size;
  if ((lVar2 < lVar1) && (pSVar5 = (this->symbols).d.ptr, pSVar5[lVar2].token == S)) {
    *relation = MatchNextSelectorIfAncestor;
    if (lVar6 < lVar1) {
      if (pSVar5[lVar6].token == S) {
        pSVar5 = pSVar5 + lVar6;
        lVar2 = -1;
        do {
          lVar7 = lVar2;
          pSVar5 = pSVar5 + 1;
          if (lVar6 - lVar1 == lVar7) break;
          lVar2 = lVar7 + -1;
        } while (pSVar5->token == S);
        this->index = iVar3 - (int)lVar7;
        iVar3 = iVar3 - (int)lVar7;
      }
      lVar6 = (long)iVar3;
    }
  }
  else {
    iVar3 = (int)lVar2;
    this->index = iVar3;
    lVar6 = lVar2;
  }
  if ((lVar6 < lVar1) &&
     (((RVar4 = MatchNextSelectorIfDirectAdjecent, (this->symbols).d.ptr[lVar6].token == PLUS ||
       (RVar4 = MatchNextSelectorIfParent, (this->symbols).d.ptr[lVar6].token == GREATER)) ||
      (RVar4 = MatchNextSelectorIfIndirectAdjecent, (this->symbols).d.ptr[lVar6].token == TILDE))))
  {
    iVar3 = iVar3 + 1;
    this->index = iVar3;
    *relation = RVar4;
  }
  lVar6 = (long)iVar3;
  lVar2 = lVar1 - lVar6;
  if (lVar2 != 0 && lVar6 <= lVar1) {
    pSVar5 = (this->symbols).d.ptr + lVar6;
    do {
      iVar3 = iVar3 + 1;
      if (pSVar5->token != S) {
        return true;
      }
      this->index = iVar3;
      pSVar5 = pSVar5 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return true;
}

Assistant:

bool Parser::parseCombinator(BasicSelector::Relation *relation)
{
    *relation = BasicSelector::NoRelation;
    if (lookup() == S) {
        *relation = BasicSelector::MatchNextSelectorIfAncestor;
        skipSpace();
    } else {
        prev();
    }
    if (test(PLUS)) {
        *relation = BasicSelector::MatchNextSelectorIfDirectAdjecent;
    } else if (test(GREATER)) {
        *relation = BasicSelector::MatchNextSelectorIfParent;
    } else if (test(TILDE)) {
        *relation = BasicSelector::MatchNextSelectorIfIndirectAdjecent;
    }
    skipSpace();
    return true;
}